

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O2

void fsnav_ins_motion_euler(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  long lVar7;
  double *pdVar8;
  fsnav_struct *pfVar9;
  long lVar10;
  fsnav_imu *pfVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  char alt_token [4];
  char lat_token [4];
  char lon_token [4];
  double local_108 [4];
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  double alt_range [2];
  double lat_range [2];
  double lon_range [2];
  double C_2 [9];
  double dvcor [3];
  
  dVar14 = fsnav_ins_motion_euler::t0;
  builtin_strncpy(lon_token,"lon",4);
  builtin_strncpy(lat_token,"lat",4);
  builtin_strncpy(alt_token,"alt",4);
  lon_range[0] = -180.0;
  lon_range[1] = 180.0;
  lat_range[0] = -90.0;
  lat_range[1] = 90.0;
  alt_range[0] = -20000.0;
  alt_range[1] = 50000.0;
  pfVar11 = fsnav->imu;
  if (pfVar11 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      (pfVar11->sol).v_valid = '\0';
      (pfVar11->sol).llh_valid = '\0';
      dVar14 = fsnav_ins_motion_parse_double
                         (lon_token,pfVar11->cfg,pfVar11->cfglength,lon_range,0.0);
      pfVar11 = fsnav->imu;
      (pfVar11->sol).llh[0] = dVar14 / (fsnav->imu_const).rad2deg;
      dVar14 = fsnav_ins_motion_parse_double
                         (lat_token,pfVar11->cfg,pfVar11->cfglength,lat_range,0.0);
      pfVar11 = fsnav->imu;
      (pfVar11->sol).llh[1] = dVar14 / (fsnav->imu_const).rad2deg;
      dVar14 = fsnav_ins_motion_parse_double
                         (alt_token,pfVar11->cfg,pfVar11->cfglength,alt_range,0.0);
      pfVar11 = fsnav->imu;
      (pfVar11->sol).llh[2] = dVar14;
      (pfVar11->sol).llh_valid = '\x01';
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        (pfVar11->sol).v[lVar7] = 0.0;
      }
      (pfVar11->sol).v_valid = '\x01';
      fsnav_ins_motion_euler::t0 = -1.0;
    }
    else if ((((-1 < fsnav->mode) && ((pfVar11->sol).v_valid != '\0')) &&
             ((pfVar11->sol).llh_valid != '\0')) &&
            ((((pfVar11->sol).L_valid != '\0' && (pfVar11->f_valid != '\0')) &&
             ((pfVar11->g_valid != '\0' &&
              (dVar13 = pfVar11->t, bVar6 = 0.0 <= fsnav_ins_motion_euler::t0,
              fsnav_ins_motion_euler::t0 = dVar13, bVar6)))))) {
      dVar3 = sin((pfVar11->sol).llh[1]);
      local_c8._8_4_ = extraout_XMM0_Dc;
      local_c8._0_8_ = dVar3;
      local_c8._12_4_ = extraout_XMM0_Dd;
      dVar4 = cos((fsnav->imu->sol).llh[1]);
      pfVar9 = fsnav;
      dVar3 = (fsnav->imu_const).e2;
      dVar12 = (double)local_c8._0_8_ * dVar3 * (double)local_c8._0_8_;
      dVar17 = dVar12 * dVar12;
      local_e8 = (dVar17 * 3.0 * 0.125 + dVar12 * 0.5 + 1.0) * (fsnav->imu_const).a;
      pfVar11 = fsnav->imu;
      dVar1 = (pfVar11->sol).llh[2];
      local_d8 = (dVar17 * dVar12 + dVar12 + 1.0 + dVar17) * (1.0 - dVar3) * local_e8 + dVar1;
      local_e8 = local_e8 + dVar1;
      (pfVar11->sol).llh_valid = '\0';
      (pfVar11->sol).v_valid = '\0';
      auVar15._0_8_ = -(pfVar11->sol).v[1];
      auVar15._8_8_ = (pfVar11->sol).v[0];
      uStack_d0 = local_c8._8_8_;
      uStack_e0 = 0;
      auVar16._8_8_ = local_e8;
      auVar16._0_8_ = local_d8;
      auVar16 = divpd(auVar15,auVar16);
      *(undefined1 (*) [16])pfVar11->W = auVar16;
      if (0.00390625 <= dVar4) {
        local_108[2] = (auVar16._8_8_ * (double)local_c8._0_8_) / dVar4;
      }
      else {
        local_108[2] = 0.0;
      }
      pfVar11->W[2] = local_108[2];
      pfVar11->W_valid = 0.00390625 <= dVar4;
      dVar13 = dVar13 - dVar14;
      local_108[0] = auVar16._0_8_;
      dVar14 = (pfVar9->imu_const).u;
      dVar14 = dVar14 + dVar14;
      local_108[1] = auVar16._8_8_ + dVar4 * dVar14;
      local_108[2] = local_108[2] + (double)local_c8._0_8_ * dVar14;
      fsnav_linal_cross3x1(dvcor,(pfVar11->sol).v,local_108);
      pfVar11 = fsnav->imu;
      if (pfVar11->w_valid == '\0') {
        pdVar8 = pfVar11->f;
      }
      else {
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          local_108[lVar7] = pfVar11->w[lVar7] * dVar13 * 0.5;
        }
        fsnav_linal_eul2mat(C_2,local_108);
        pfVar11 = fsnav->imu;
        pdVar8 = C_2 + 1;
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          dVar14 = C_2[lVar7 * 3] * pfVar11->f[0];
          C_2[lVar7] = dVar14;
          for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
            dVar14 = dVar14 + pdVar8[lVar10] * pfVar11->f[lVar10 + 1];
            C_2[lVar7] = dVar14;
          }
          pdVar8 = pdVar8 + 3;
        }
        pdVar8 = C_2;
      }
      fsnav_linal_mmul1T(local_108,(pfVar11->sol).L,pdVar8,3,3,1);
      pfVar9 = fsnav;
      pfVar11 = fsnav->imu;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        (pfVar11->sol).v[lVar7] =
             (dvcor[lVar7] + local_108[lVar7] + pfVar11->g[lVar7]) * dVar13 +
             (pfVar11->sol).v[lVar7];
      }
      (pfVar11->sol).v_valid = '\x01';
      if (dVar4 < 0.00390625) {
        (pfVar11->sol).llh[2] = dVar13 * (pfVar11->sol).v[2] + (pfVar11->sol).llh[2];
        (pfVar11->sol).llh_valid = '\0';
      }
      else {
        auVar5._8_8_ = local_d8;
        auVar5._0_8_ = dVar4 * local_e8;
        auVar16 = divpd(*(undefined1 (*) [16])(pfVar11->sol).v,auVar5);
        dVar3 = dVar13 * auVar16._8_8_ + (pfVar11->sol).llh[1];
        auVar2._8_4_ = SUB84(dVar3,0);
        auVar2._0_8_ = dVar13 * auVar16._0_8_ + (pfVar11->sol).llh[0];
        auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
        *(undefined1 (*) [16])(pfVar11->sol).llh = auVar2;
        (pfVar11->sol).llh[2] = dVar13 * (pfVar11->sol).v[2] + (pfVar11->sol).llh[2];
        dVar14 = (pfVar9->imu_const).pi;
        if (dVar3 < dVar14 * -0.5) {
          (pfVar11->sol).llh[1] = -dVar14 - dVar3;
          fsnav_ins_motion_flip_sol_over_pole(&pfVar11->sol);
          pfVar11 = fsnav->imu;
          dVar3 = (pfVar11->sol).llh[1];
          dVar14 = (fsnav->imu_const).pi;
          pfVar9 = fsnav;
        }
        if (dVar14 * 0.5 < dVar3) {
          (pfVar11->sol).llh[1] = dVar14 - dVar3;
          fsnav_ins_motion_flip_sol_over_pole(&pfVar11->sol);
          pfVar11 = fsnav->imu;
          pfVar9 = fsnav;
        }
        dVar14 = (pfVar11->sol).llh[0];
        while (dVar13 = (pfVar9->imu_const).pi, dVar14 < -dVar13) {
          dVar14 = dVar14 + dVar13 + dVar13;
          (pfVar11->sol).llh[0] = dVar14;
        }
        while (dVar13 < dVar14) {
          dVar14 = dVar14 - (dVar13 + dVar13);
          (pfVar11->sol).llh[0] = dVar14;
          dVar13 = (pfVar9->imu_const).pi;
        }
        (pfVar11->sol).llh_valid = '\x01';
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_motion_euler(void) {

	const char 
		lon_token[] = "lon",        // starting longitude parameter name in configuration
		lat_token[] = "lat",        // starting latitude  parameter name in configuration
		alt_token[] = "alt";        // starting altitude  parameter name in configuration

	const double 
		lon_range[] = {-180, +180},	// longitude range, 0 by default
		lat_range[] = { -90,  +90},	// latitude  range, 0 by default
		alt_range[] = {-20e3,50e3},	// altitude  range, 0 by default
		eps = 1.0/0x0100;			// 2^-8, guaranteed non-zero value in IEEE754 half-precision format

	static double t0  = -1;         // previous time

	double dt;                      // time step
	double
		sphi, cphi,	                // sine and cosine of latitude
		Rn_h, Re_h,	                // south-to-north and east-to-west curvature radii, altitude-adjusted
		e2s2, e4s4,	                // e^2*sin(phi)^2, (e^2*sin(phi)^2)^2
		dvrel[3],	                // proper acceleration in navigation frame
		dvcor[3],	                // Coriolis acceleration in navigation frame
		C_2[9];                     // intermediate matrix/vector for modified Euler component
	size_t i, j;                    // common index variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// drop validity flags
		fsnav->imu->sol.  v_valid = 0;
		fsnav->imu->sol.llh_valid = 0;		
		// parse parameters from configuration	
		fsnav->imu->sol.llh[0] = // starting longitude
			fsnav_ins_motion_parse_double(lon_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lon_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[1] = // starting latitude
			fsnav_ins_motion_parse_double(lat_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lat_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[2] = // starting altitude
			fsnav_ins_motion_parse_double(alt_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)alt_range,0);
		// raise coordinates validity flag
		fsnav->imu->sol.llh_valid = 1;
		// zero velocity at start
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
		// reset previous time
		t0 = -1;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}

	else						// main cycle
	{
		// check for crucial data initialized
		if (   !fsnav->imu->sol.  v_valid 
			|| !fsnav->imu->sol.llh_valid 
			|| !fsnav->imu->sol.  L_valid 
			|| !fsnav->imu->f_valid 
			|| !fsnav->imu->g_valid)
			return;
		// time variables
		if (t0 < 0) { // first touch
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		// ellipsoid geometry
		sphi = sin(fsnav->imu->sol.llh[1]);
		cphi = cos(fsnav->imu->sol.llh[1]);
		e2s2 = fsnav->imu_const.e2*sphi*sphi;
		e4s4 = e2s2*e2s2;					
		Re_h = fsnav->imu_const.a*(1 + e2s2/2 + 3*e4s4/8);	                                        // Taylor expansion within 0.5 m, not altitude-adjusted
		Rn_h = Re_h*(1 - fsnav->imu_const.e2)*(1 + e2s2 + e4s4 + e2s2*e4s4) + fsnav->imu->sol.llh[2]; // Taylor expansion within 0.5 m
		Re_h += fsnav->imu->sol.llh[2];						                                        // adjust for altitude
		// drop validity flags
		fsnav->imu->W_valid       = 0;
		fsnav->imu->sol.llh_valid = 0;
		fsnav->imu->sol.  v_valid = 0;
		// angular rate of navigation frame relative to the Earth
		fsnav->imu->W[0] = -fsnav->imu->sol.v[1]/Rn_h;
		fsnav->imu->W[1] =  fsnav->imu->sol.v[0]/Re_h;	
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->W[2] = 0;    // freeze
			fsnav->imu->W_valid = 0; // drop validity
		}
		else {
			fsnav->imu->W[2] = fsnav->imu->sol.v[0]/Re_h*sphi/cphi;
			fsnav->imu->W_valid = 1;
		}
		// velocity
			// Coriolis acceleration
		dvrel[0] = fsnav->imu->W[0];
		dvrel[1] = fsnav->imu->W[1] + 2*fsnav->imu_const.u*cphi;
		dvrel[2] = fsnav->imu->W[2] + 2*fsnav->imu_const.u*sphi;
		fsnav_linal_cross3x1(dvcor, fsnav->imu->sol.v, dvrel);
			// proper acceleration
		if (fsnav->imu->w_valid) { // if able to calculate attitude mid-point using gyroscopes
			for (i = 0; i < 3; i++)
				dvrel[i] = fsnav->imu->w[i]*dt/2; // midpoint rotation Euler vector
			fsnav_linal_eul2mat(C_2, dvrel); // midpoint attitude matrix factor
			for (i = 0; i < 3; i++) // multiply C_2*f, store in the first row of C_2
				for (j = 1, C_2[i] = C_2[i*3]*fsnav->imu->f[0]; j < 3; j++)
					C_2[i] += C_2[i*3+j]*fsnav->imu->f[j];
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, C_2, 3, 3, 1); // dvrel = L^T(t+dt)*C_2(w*dt/2)*f
		}
		else // otherwise, go on with only the current attitude matrix
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, fsnav->imu->f, 3, 3, 1);
			// velocity update
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] += (dvcor[i] + dvrel[i] + fsnav->imu->g[i])*dt;
		fsnav->imu->sol.v_valid = 1;
		// coordinates
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			fsnav->imu->sol.llh_valid = 0; // drop validity
		}
		else {
			fsnav->imu->sol.llh[0] += fsnav->imu->sol.v[0]/(Re_h*cphi)	*dt;
			fsnav->imu->sol.llh[1] += fsnav->imu->sol.v[1]/ Rn_h			*dt;
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			// flip latitude if crossed a pole
			if (fsnav->imu->sol.llh[1] < -fsnav->imu_const.pi/2) { // South pole
				fsnav->imu->sol.llh[1] = -fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			if (fsnav->imu->sol.llh[1] > +fsnav->imu_const.pi/2) { // North pole
				fsnav->imu->sol.llh[1] = +fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			// adjust longitude into range
			while (fsnav->imu->sol.llh[0] < -fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] += 2*fsnav->imu_const.pi;
			while (fsnav->imu->sol.llh[0] > +fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] -= 2*fsnav->imu_const.pi;
			fsnav->imu->sol.llh_valid = 1;
		}
	}

}